

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O3

void sha256_final(sha256_t *p,uchar *digest)

{
  uint64_t uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  
  uVar1 = p->count;
  uVar4 = (ulong)((uint)uVar1 & 0x3f);
  p->buffer[uVar4] = 0x80;
  while (uVar3 = (int)uVar4 + 1, uVar3 != 0x38) {
    uVar3 = uVar3 & 0x3f;
    uVar4 = (ulong)uVar3;
    if (uVar3 == 0) {
      sha256_write_byte_block(p);
    }
    p->buffer[uVar4] = '\0';
  }
  lVar5 = uVar1 << 3;
  lVar2 = 0x60;
  do {
    *(char *)((long)p->state + lVar2) = (char)((ulong)lVar5 >> 0x38);
    lVar5 = lVar5 << 8;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x68);
  sha256_write_byte_block(p);
  lVar2 = 0;
  do {
    digest[lVar2 * 4] = *(uchar *)((long)p->state + lVar2 * 4 + 3);
    digest[lVar2 * 4 + 1] = *(uchar *)((long)p->state + lVar2 * 4 + 2);
    digest[lVar2 * 4 + 2] = *(uchar *)((long)p->state + lVar2 * 4 + 1);
    digest[lVar2 * 4 + 3] = (uchar)p->state[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  p->state[0] = 0x6a09e667;
  p->state[1] = 0xbb67ae85;
  p->state[2] = 0x3c6ef372;
  p->state[3] = 0xa54ff53a;
  p->state[4] = 0x510e527f;
  p->state[5] = 0x9b05688c;
  p->state[6] = 0x1f83d9ab;
  p->state[7] = 0x5be0cd19;
  p->count = 0;
  return;
}

Assistant:

void
sha256_final(sha256_t *p, unsigned char *digest)
{
  uint64_t lenInBits = (p->count << 3);
  uint32_t curBufferPos = (uint32_t)p->count & 0x3F;
  unsigned i;
  p->buffer[curBufferPos++] = 0x80;
  while (curBufferPos != (64 - 8))
  {
    curBufferPos &= 0x3F;
    if (curBufferPos == 0)
      sha256_write_byte_block(p);
    p->buffer[curBufferPos++] = 0;
  }
  for (i = 0; i < 8; i++)
  {
    p->buffer[curBufferPos++] = (unsigned char)(lenInBits >> 56);
    lenInBits <<= 8;
  }
  sha256_write_byte_block(p);

  for (i = 0; i < 8; i++)
  {
    *digest++ = (unsigned char)(p->state[i] >> 24);
    *digest++ = (unsigned char)(p->state[i] >> 16);
    *digest++ = (unsigned char)(p->state[i] >> 8);
    *digest++ = (unsigned char)(p->state[i]);
  }
  sha256_init(p);
}